

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  int *piVar1;
  PlatformInterface *pPVar2;
  long *plVar3;
  undefined8 uVar4;
  deUint32 dVar5;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  size_t sVar8;
  size_t sVar9;
  char *__s;
  size_t sVar10;
  deUint64 *pdVar11;
  long *plVar12;
  Parameters *extraout_RDX;
  ulong uVar13;
  size_type __n;
  long lVar14;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  objects;
  Environment env_1;
  VkImageView attachments_1 [2];
  Resources res_1;
  Environment env;
  VkImageView attachments [2];
  Resources res;
  undefined1 local_388 [16];
  pointer local_378;
  VkAllocationCallbacks *pVStack_370;
  undefined1 local_368 [16];
  VkDevice local_358;
  VkAllocationCallbacks *pVStack_350;
  ProgramCollection<vk::ProgramBinary> *local_348;
  VkAllocationCallbacks *local_340;
  deUint32 local_338;
  Move<vk::Handle<(vk::HandleType)23>_> local_328;
  undefined1 local_308 [8];
  Handle<(vk::HandleType)9> local_300;
  TestLog local_2f8;
  VkRenderPass local_2f0;
  deUint32 local_2e8;
  Move<vk::Handle<(vk::HandleType)23>_> *local_2e0;
  Handle<(vk::HandleType)7> local_2d8;
  deUint32 local_2d0;
  Handle<(vk::HandleType)13> local_2b8;
  ios_base local_290 [72];
  Handle<(vk::HandleType)13> local_248;
  Handle<(vk::HandleType)17> local_220;
  undefined1 local_188 [20];
  uint uStack_174;
  VkRenderPass local_170;
  ProgramCollection<vk::ProgramBinary> *local_168;
  VkAllocationCallbacks *local_160;
  undefined8 local_158;
  deUint32 local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [80];
  Handle<(vk::HandleType)13> local_e8;
  Handle<(vk::HandleType)13> local_78;
  Handle<(vk::HandleType)17> local_50;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_138,allocator,0x400);
  pPVar2 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  dVar5 = Context::getUniversalQueueFamilyIndex(context);
  local_348 = context->m_progCollection;
  local_340 = (VkAllocationCallbacks *)(local_138 + 8);
  pVStack_350 = (VkAllocationCallbacks *)CONCAT44(pVStack_350._4_4_,dVar5);
  local_338 = 1;
  local_368._0_8_ = pPVar2;
  local_368._8_8_ = pDVar6;
  local_358 = pVVar7;
  Framebuffer::Resources::Resources
            ((Resources *)local_308,(Environment *)local_368,(Parameters *)local_340);
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_138);
  local_160 = (VkAllocationCallbacks *)local_148;
  local_148._0_8_ = local_2b8.m_internal;
  local_148._8_8_ = local_248.m_internal;
  local_188._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_188._8_8_ = (DeviceInterface *)0x0;
  stack0xfffffffffffffe88 = (VkDevice)((ulong)uStack_174 << 0x20);
  local_170.m_internal = local_220.m_internal;
  local_168 = (ProgramCollection<vk::ProgramBinary> *)CONCAT44(local_168._4_4_,2);
  local_158._0_4_ = 0x100;
  local_158._4_4_ = 0x100;
  local_150 = 1;
  ::vk::createFramebuffer
            (&local_328,(DeviceInterface *)local_368._8_8_,local_358,
             (VkFramebufferCreateInfo *)local_188,local_340);
  local_388._0_8_ =
       local_328.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_388._8_8_ =
       local_328.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_378 = (pointer)local_328.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_device;
  pVStack_370 = local_328.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  sVar9 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_138);
  if (local_388._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_388 + 8),
               (VkFramebuffer)local_388._0_8_);
  }
  Framebuffer::Resources::~Resources((Resources *)local_308);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_138);
  sVar8 = getSafeObjectCount(context,sVar9 - sVar8,0);
  __n = 0x4000;
  if (sVar8 < 0x4000) {
    __n = sVar8;
  }
  local_188._0_8_ = context->m_platformInterface;
  local_188._8_8_ = Context::getDeviceInterface(context);
  register0x00000000 = Context::getDevice(context);
  dVar5 = Context::getUniversalQueueFamilyIndex(context);
  local_170.m_internal._0_4_ = dVar5;
  local_168 = context->m_progCollection;
  local_160 = (VkAllocationCallbacks *)0x0;
  local_158._0_4_ = (deUint32)__n;
  Framebuffer::Resources::Resources((Resources *)local_138,(Environment *)local_188,extraout_RDX);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
            *)local_388,__n,(allocator_type *)local_308);
  local_308 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_300);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_300,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_300);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_300," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)23>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_300 +
                    (int)*(undefined8 *)(local_300.m_internal - 0x18));
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_300,__s,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_300," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_300);
  std::ios_base::~ios_base(local_290);
  if (sVar8 != 0) {
    lVar14 = 8;
    uVar13 = 0;
    do {
      pdVar11 = (deUint64 *)operator_new(0x20);
      local_328.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
           local_e8.m_internal;
      local_328.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)local_78.m_internal;
      local_308._0_4_ = 0x25;
      local_300.m_internal = 0;
      local_2f8.m_log._0_4_ = 0;
      local_2f0.m_internal = local_50.m_internal;
      local_2e8 = 2;
      local_2e0 = &local_328;
      local_2d8.m_internal = 0x10000000100;
      local_2d0 = 1;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)local_368,
                 (DeviceInterface *)local_188._8_8_,stack0xfffffffffffffe88,
                 (VkFramebufferCreateInfo *)local_308,local_160);
      pdVar11[2] = (deUint64)local_358;
      pdVar11[3] = (deUint64)pVStack_350;
      *pdVar11 = local_368._0_8_;
      pdVar11[1] = local_368._8_8_;
      local_368._0_8_ = (PlatformInterface *)0x0;
      local_368._8_8_ = (DeviceInterface *)0x0;
      local_358 = (VkDevice)0x0;
      pVStack_350 = (VkAllocationCallbacks *)0x0;
      plVar12 = (long *)operator_new(0x20);
      uVar4 = local_388._0_8_;
      *(undefined4 *)(plVar12 + 1) = 0;
      *(undefined4 *)((long)plVar12 + 0xc) = 0;
      *plVar12 = (long)&PTR__SharedPtrState_00d538a0;
      plVar12[2] = (long)pdVar11;
      *(undefined4 *)(plVar12 + 1) = 1;
      *(undefined4 *)((long)plVar12 + 0xc) = 1;
      plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)local_388._0_8_ + lVar14
                         );
      if (plVar3 != plVar12) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)(local_388._0_8_ + lVar14 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)
                                           local_388._0_8_ + lVar14) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar4 +
                                    lVar14) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar3 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar4 + lVar14);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar4 + lVar14) = 0;
          }
        }
        *(deUint64 **)(uVar4 + lVar14 + -8) = pdVar11;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar4 + lVar14) = plVar12;
        LOCK();
        *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)23>_> **)uVar4 + lVar14)
                        + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar3 = plVar12 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar12 + 0x10))(plVar12);
      }
      LOCK();
      piVar1 = (int *)((long)plVar12 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if (local_368._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_368 + 8),
                   (VkFramebuffer)local_368._0_8_);
      }
      if ((uVar13 & 0x3ff) == 0 && uVar13 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (__n != uVar13);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
                     *)local_388,(pointer)local_388._0_8_);
  local_308 = (undefined1  [8])&local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_308,
             (long)(qpTestLog **)local_308 + local_300.m_internal);
  if (local_308 != (undefined1  [8])&local_2f8) {
    operator_delete((void *)local_308,
                    CONCAT44(local_2f8.m_log._4_4_,(VkFramebufferCreateFlags)local_2f8.m_log) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
             *)local_388);
  Framebuffer::Resources::~Resources((Resources *)local_138);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}